

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::Synchronize(WastParser *this,SynchronizeFunc *func)

{
  string *__return_storage_ptr__;
  TokenTypePair TVar1;
  int iVar2;
  bool bVar3;
  undefined1 auStack_c8 [8];
  Token token;
  
  iVar2 = 10;
  __return_storage_ptr__ = (string *)(token.field_2.literal_.text.field_2._M_local_buf + 8);
  while( true ) {
    bVar3 = iVar2 == 0;
    iVar2 = iVar2 + -1;
    if (bVar3) {
      return (Result)Error;
    }
    TVar1 = PeekPair(this);
    bVar3 = (*func)((TokenTypePair)TVar1._M_elems);
    if (bVar3) break;
    Consume((Token *)auStack_c8,this);
    if (token.loc.field_1.field_0.last_column == 0x5f) {
      Token::to_string_clamp_abi_cxx11_(__return_storage_ptr__,(Token *)auStack_c8,0x50);
      Error(this,0x101ef4b,(char *)token.field_2._32_8_);
      std::__cxx11::string::~string((string *)__return_storage_ptr__);
    }
    Token::~Token((Token *)auStack_c8);
  }
  return (Result)Ok;
}

Assistant:

Result WastParser::Synchronize(SynchronizeFunc func) {
  static const int kMaxConsumed = 10;
  for (int i = 0; i < kMaxConsumed; ++i) {
    if (func(PeekPair())) {
      return Result::Ok;
    }

    Token token = Consume();
    if (token.token_type() == TokenType::Reserved) {
      Error(token.loc, "unexpected token %s.",
            token.to_string_clamp(kMaxErrorTokenLength).c_str());
    }
  }

  return Result::Error;
}